

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_space_time_stack.cpp
# Opt level: O3

void __thiscall
KokkosTools::SpaceTimeStack::StackNode::print_recursive_json
          (StackNode *this,ostream *os,StackNode *parent,double tree_time)

{
  _Base_ptr *pp_Var1;
  _Rb_tree_header *p_Var2;
  _Rb_tree_header *p_Var3;
  double dVar4;
  double dVar5;
  long lVar6;
  long lVar7;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  ostream *poVar8;
  _Rb_tree_node_base *p_Var9;
  ulong uVar10;
  _Base_ptr p_Var11;
  long lVar12;
  char *pcVar13;
  double dVar14;
  set<const_KokkosTools::SpaceTimeStack::StackNode_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_kokkos[P]kokkos_tools_profiling_space_time_stack_kp_space_time_stack_cpp:308:20),_std::allocator<const_KokkosTools::SpaceTimeStack::StackNode_*>_>
  children_by_time;
  _Rb_tree<const_KokkosTools::SpaceTimeStack::StackNode_*,_const_KokkosTools::SpaceTimeStack::StackNode_*,_std::_Identity<const_KokkosTools::SpaceTimeStack::StackNode_*>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_kokkos[P]kokkos_tools_profiling_space_time_stack_kp_space_time_stack_cpp:308:20),_std::allocator<const_KokkosTools::SpaceTimeStack::StackNode_*>_>
  local_90;
  double local_60;
  double local_58;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_50;
  
  dVar14 = (this->total_runtime / tree_time) * 100.0;
  if (output_threshold <= dVar14) {
    local_58 = tree_time;
    if ((this->name)._M_string_length != 0) {
      if (print_recursive_json::add_comma) {
        std::__ostream_insert<char,std::char_traits<char>>(os,",\n",2);
      }
      print_recursive_json::add_comma = true;
      std::__ostream_insert<char,std::char_traits<char>>(os,"{\n",2);
      dVar4 = this->max_runtime;
      dVar5 = this->avg_runtime;
      std::__ostream_insert<char,std::char_traits<char>>(os,"\"average-time\" : ",0x11);
      lVar12 = *(long *)os;
      lVar6 = *(long *)(lVar12 + -0x18);
      *(uint *)(os + lVar6 + 0x18) = *(uint *)(os + lVar6 + 0x18) & 0xfffffefb | 0x100;
      *(undefined8 *)(os + *(long *)(lVar12 + -0x18) + 8) = 2;
      poVar8 = std::ostream::_M_insert<double>(this->avg_runtime);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,",\n",2);
      lVar12 = *(long *)os;
      lVar6 = *(long *)(lVar12 + -0x18);
      *(uint *)(os + lVar6 + 0x18) = *(uint *)(os + lVar6 + 0x18) & 0xfffffefb | 4;
      *(undefined8 *)(os + *(long *)(lVar12 + -0x18) + 8) = 1;
      local_60 = (this->total_kokkos_runtime / this->total_runtime) * 100.0;
      std::__ostream_insert<char,std::char_traits<char>>(os,"\"percent\" : ",0xc);
      poVar8 = std::ostream::_M_insert<double>(dVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,",\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(os,"\"percent-kokkos\" : ",0x13);
      poVar8 = std::ostream::_M_insert<double>(local_60);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,",\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(os,"\"imbalance\" : ",0xe);
      poVar8 = std::ostream::_M_insert<double>((dVar4 / dVar5 + -1.0) * 100.0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,",\n",2);
      if (this->kind == STACK_REGION) {
        dVar14 = 0.0;
        for (p_Var9 = (this->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var9 != &(this->children)._M_t._M_impl.super__Rb_tree_header;
            p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
          dVar14 = dVar14 + *(double *)(p_Var9 + 4);
        }
        dVar4 = this->total_runtime;
        lVar12 = this->total_number_of_kernel_calls;
        dVar5 = this->avg_runtime;
        std::__ostream_insert<char,std::char_traits<char>>(os,"\"remainder\" : ",0xe);
        poVar8 = std::ostream::_M_insert<double>((1.0 - dVar14 / dVar4) * 100.0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,",\n",2);
        lVar6 = *(long *)os;
        lVar7 = *(long *)(lVar6 + -0x18);
        *(uint *)(os + lVar7 + 0x18) = *(uint *)(os + lVar7 + 0x18) & 0xfffffefb | 0x100;
        *(undefined8 *)(os + *(long *)(lVar6 + -0x18) + 8) = 2;
        std::__ostream_insert<char,std::char_traits<char>>(os,"\"kernels-per-second\" : ",0x17);
        poVar8 = std::ostream::_M_insert<double>((double)lVar12 / dVar5);
        lVar12 = 2;
        pcVar13 = ",\n";
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(os,"\"remainder\" : \"N/A\",\n",0x15);
        pcVar13 = "\"kernels-per-second\" : \"N/A\",\n";
        lVar12 = 0x1e;
        poVar8 = os;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar13,lVar12);
      std::__ostream_insert<char,std::char_traits<char>>(os,"\"number-of-calls\" : ",0x14);
      poVar8 = std::ostream::_M_insert<long>((long)os);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,",\n",2);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&local_50,"\"",0x10);
      pp_Var1 = &local_90._M_impl.super__Rb_tree_header._M_header._M_parent;
      local_90._M_impl.super__Rb_tree_header._M_header._0_8_ = 0;
      local_90._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)
           ((ulong)local_90._M_impl.super__Rb_tree_header._M_header._M_parent & 0xffffffffffffff00);
      __first._M_current = (this->name)._M_dataplus._M_p;
      local_90._M_impl._0_8_ = pp_Var1;
      std::
      __regex_replace<std::back_insert_iterator<std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::regex_traits<char>,char>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_90,
                 __first,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(__first._M_current + (this->name)._M_string_length),&local_50,"\\\"",2,0
                );
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_50);
      std::__ostream_insert<char,std::char_traits<char>>(os,"\"name\" : \"",10);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,(char *)local_90._M_impl._0_8_,
                          local_90._M_impl.super__Rb_tree_header._M_header._0_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\",\n",3);
      std::__ostream_insert<char,std::char_traits<char>>(os,"\"parent-id\" : \"",0xf);
      poVar8 = std::ostream::_M_insert<void_const*>(os);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\",\n",3);
      std::__ostream_insert<char,std::char_traits<char>>(os,"\"id\" : \"",8);
      poVar8 = std::ostream::_M_insert<void_const*>(os);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\",\n",3);
      std::__ostream_insert<char,std::char_traits<char>>(os,"\"kernel-type\" : ",0x10);
      uVar10 = (ulong)this->kind;
      if (uVar10 < 5) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (os,&DAT_0012e808 + *(int *)(&DAT_0012e808 + uVar10 * 4),
                   *(long *)(&DAT_0012e820 + uVar10 * 8));
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"\n}",2);
      if ((_Base_ptr *)local_90._M_impl._0_8_ != pp_Var1) {
        operator_delete((void *)local_90._M_impl._0_8_,
                        (ulong)((long)&(local_90._M_impl.super__Rb_tree_header._M_header._M_parent)
                                       ->_M_color + 1));
      }
    }
    if ((this->children)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      p_Var2 = &local_90._M_impl.super__Rb_tree_header;
      local_90._M_impl.super__Rb_tree_header._M_header._0_8_ =
           local_90._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
      local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
      p_Var11 = (this->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var3 = &(this->children)._M_t._M_impl.super__Rb_tree_header;
      local_90._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
      local_90._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
      if ((_Rb_tree_header *)p_Var11 != p_Var3) {
        do {
          local_50._0_8_ = p_Var11 + 1;
          std::
          _Rb_tree<KokkosTools::SpaceTimeStack::StackNode_const*,KokkosTools::SpaceTimeStack::StackNode_const*,std::_Identity<KokkosTools::SpaceTimeStack::StackNode_const*>,KokkosTools::SpaceTimeStack::StackNode::print_recursive_json(std::ostream&,KokkosTools::SpaceTimeStack::StackNode_const*,double)const::{lambda(KokkosTools::SpaceTimeStack::StackNode_const*,KokkosTools::SpaceTimeStack::StackNode_const*)#1},std::allocator<KokkosTools::SpaceTimeStack::StackNode_const*>>
          ::_M_insert_unique<KokkosTools::SpaceTimeStack::StackNode_const*>
                    ((_Rb_tree<KokkosTools::SpaceTimeStack::StackNode_const*,KokkosTools::SpaceTimeStack::StackNode_const*,std::_Identity<KokkosTools::SpaceTimeStack::StackNode_const*>,KokkosTools::SpaceTimeStack::StackNode::print_recursive_json(std::ostream&,KokkosTools::SpaceTimeStack::StackNode_const*,double)const::_lambda(KokkosTools::SpaceTimeStack::StackNode_const*,KokkosTools::SpaceTimeStack::StackNode_const*)_1_,std::allocator<KokkosTools::SpaceTimeStack::StackNode_const*>>
                      *)&local_90,(StackNode **)&local_50);
          p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
          p_Var9 = local_90._M_impl.super__Rb_tree_header._M_header._M_left;
        } while ((_Rb_tree_header *)p_Var11 != p_Var3);
        for (; (_Rb_tree_header *)p_Var9 != p_Var2;
            p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
          print_recursive_json(*(StackNode **)(p_Var9 + 1),os,this,local_58);
        }
      }
      std::
      _Rb_tree<const_KokkosTools::SpaceTimeStack::StackNode_*,_const_KokkosTools::SpaceTimeStack::StackNode_*,_std::_Identity<const_KokkosTools::SpaceTimeStack::StackNode_*>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/space-time-stack/kp_space_time_stack.cpp:308:20),_std::allocator<const_KokkosTools::SpaceTimeStack::StackNode_*>_>
      ::~_Rb_tree(&local_90);
    }
  }
  return;
}

Assistant:

void print_recursive_json(std::ostream& os, StackNode const* parent,
                            double tree_time) const {
    static bool add_comma = false;
    auto percent          = (total_runtime / tree_time) * 100.0;

    if (percent < output_threshold) return;
    if (!name.empty()) {
      if (add_comma) os << ",\n";
      add_comma = true;
      os << "{\n";
      auto imbalance = (max_runtime / avg_runtime - 1.0) * 100.0;
      os << "\"average-time\" : ";
      os << std::scientific << std::setprecision(2);
      os << avg_runtime << ",\n";
      os << std::fixed << std::setprecision(1);
      auto percent_kokkos = (total_kokkos_runtime / total_runtime) * 100.0;

      os << "\"percent\" : " << percent << ",\n";
      os << "\"percent-kokkos\" : " << percent_kokkos << ",\n";
      os << "\"imbalance\" : " << imbalance << ",\n";

      // Sum over kids if we're a region
      if (kind == STACK_REGION) {
        double child_runtime = 0.0;
        for (auto& child : children) {
          child_runtime += child.total_runtime;
        }
        auto remainder = (1.0 - child_runtime / total_runtime) * 100.0;
        double kps     = total_number_of_kernel_calls / avg_runtime;
        os << "\"remainder\" : " << remainder << ",\n";
        os << std::scientific << std::setprecision(2);
        os << "\"kernels-per-second\" : " << kps << ",\n";
      } else {
        os << "\"remainder\" : \"N/A\",\n";
        os << "\"kernels-per-second\" : \"N/A\",\n";
      }
      os << "\"number-of-calls\" : " << number_of_calls << ",\n";
      auto name_escape_double_quote_twices =
          std::regex_replace(name, std::regex("\""), "\\\"");
      os << "\"name\" : \"" << name_escape_double_quote_twices << "\",\n";
      os << "\"parent-id\" : \"" << parent << "\",\n";
      os << "\"id\" : \"" << this << "\",\n";

      os << "\"kernel-type\" : ";
      switch (kind) {
        case STACK_FOR: os << "\"for\""; break;
        case STACK_REDUCE: os << "\"reduce\""; break;
        case STACK_SCAN: os << "\"scan\""; break;
        case STACK_REGION: os << "\"region\""; break;
        case STACK_COPY: os << "\"copy\""; break;
      };

      os << "\n}";
    }
    if (children.empty()) return;
    auto by_time = [](StackNode const* a, StackNode const* b) {
      if (a->total_runtime != b->total_runtime) {
        return a->total_runtime > b->total_runtime;
      }
      return a->name < b->name;
    };
    std::set<StackNode const*, decltype(by_time)> children_by_time(by_time);
    for (auto& child : children) {
      children_by_time.insert(&child);
    }
    auto last = children_by_time.end();
    --last;
    for (auto it = children_by_time.begin(); it != children_by_time.end();
         ++it) {
      auto child = *it;
      child->print_recursive_json(os, this, tree_time);
    }
  }